

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_device.c
# Opt level: O1

MPP_RET mpp_dev_deinit(MppDev ctx)

{
  code *pcVar1;
  MPP_RET MVar2;
  
  if (ctx == (MppDev)0x0) {
    _mpp_log_l(2,"mpp_device","found NULL input ctx\n","mpp_dev_deinit");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar2 = MPP_OK;
    if (((*(long *)((long)ctx + 0x10) != 0) &&
        (pcVar1 = *(code **)(*(long *)((long)ctx + 0x10) + 0x18), pcVar1 != (code *)0x0)) &&
       (*(long *)((long)ctx + 8) != 0)) {
      MVar2 = (*pcVar1)();
    }
    if (*(void **)((long)ctx + 8) != (void *)0x0) {
      mpp_osal_free("mpp_dev_deinit",*(void **)((long)ctx + 8));
    }
    *(undefined8 *)((long)ctx + 8) = 0;
    mpp_osal_free("mpp_dev_deinit",ctx);
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_dev_deinit(MppDev ctx)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input ctx\n");
        return MPP_ERR_NULL_PTR;
    }

    MppDevImpl *p = (MppDevImpl *)ctx;
    MPP_RET ret = MPP_OK;

    if (p->api && p->api->deinit && p->ctx)
        ret = p->api->deinit(p->ctx);

    MPP_FREE(p->ctx);
    MPP_FREE(p);

    return ret;
}